

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppSimpleOverlay(bool *p_open)

{
  bool bVar1;
  undefined1 *in_RDI;
  ImVec2 window_pos_pivot;
  ImVec2 window_pos;
  ImVec2 work_size;
  ImVec2 work_pos;
  ImGuiViewport *viewport;
  ImGuiWindowFlags window_flags;
  ImGuiIO *io;
  float PAD;
  char *in_stack_00000068;
  ImGuiWindowFlags in_stack_000003b4;
  bool *in_stack_000003b8;
  char *in_stack_000003c0;
  float local_5c;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImGuiViewport *local_28;
  uint local_1c;
  ImGuiIO *local_18;
  undefined4 local_c;
  undefined1 *local_8;
  
  local_c = 0x41200000;
  local_8 = in_RDI;
  local_18 = ImGui::GetIO();
  local_1c = 0xc116b;
  if (ShowExampleAppSimpleOverlay::corner != -1) {
    local_28 = ImGui::GetMainViewport();
    local_30 = local_28->WorkPos;
    local_38 = local_28->WorkSize;
    ImVec2::ImVec2(&local_40);
    ImVec2::ImVec2(&local_48);
    if ((ShowExampleAppSimpleOverlay::corner & 1U) == 0) {
      in_stack_ffffffffffffffb4 = local_30.x + 10.0;
    }
    else {
      in_stack_ffffffffffffffb4 = (local_30.x + local_38.x) - 10.0;
    }
    if ((ShowExampleAppSimpleOverlay::corner & 2U) == 0) {
      in_stack_ffffffffffffffb0 = local_30.y + 10.0;
    }
    else {
      in_stack_ffffffffffffffb0 = (local_30.y + local_38.y) - 10.0;
    }
    in_stack_ffffffffffffffac = 1.0;
    if ((ShowExampleAppSimpleOverlay::corner & 1U) == 0) {
      in_stack_ffffffffffffffac = 0.0;
    }
    local_5c = 1.0;
    if ((ShowExampleAppSimpleOverlay::corner & 2U) == 0) {
      local_5c = 0.0;
    }
    local_48.y = local_5c;
    local_48.x = in_stack_ffffffffffffffac;
    local_40.x = in_stack_ffffffffffffffb4;
    local_40.y = in_stack_ffffffffffffffb0;
    ImGui::SetNextWindowPos(&local_40,1,&local_48);
    local_1c = local_1c | 4;
  }
  ImGui::SetNextWindowBgAlpha(0.35);
  bVar1 = ImGui::Begin(in_stack_000003c0,in_stack_000003b8,in_stack_000003b4);
  if (bVar1) {
    ImGui::Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
    ImGui::Separator();
    bVar1 = ImGui::IsMousePosValid((ImVec2 *)0x0);
    if (bVar1) {
      ImGui::Text((char *)(double)(local_18->MousePos).x,(double)(local_18->MousePos).y,
                  "Mouse Position: (%.1f,%.1f)");
    }
    else {
      ImGui::Text("Mouse Position: <invalid>");
    }
    bVar1 = ImGui::BeginPopupContextWindow
                      ((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (ImGuiPopupFlags)in_stack_ffffffffffffffac);
    if (bVar1) {
      bVar1 = ImGui::MenuItem(in_stack_00000068,p_open,PAD._3_1_,PAD._2_1_);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = -1;
      }
      bVar1 = ImGui::MenuItem(in_stack_00000068,p_open,PAD._3_1_,PAD._2_1_);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = 0;
      }
      bVar1 = ImGui::MenuItem(in_stack_00000068,p_open,PAD._3_1_,PAD._2_1_);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = 1;
      }
      bVar1 = ImGui::MenuItem(in_stack_00000068,p_open,PAD._3_1_,PAD._2_1_);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = 2;
      }
      bVar1 = ImGui::MenuItem(in_stack_00000068,p_open,PAD._3_1_,PAD._2_1_);
      if (bVar1) {
        ShowExampleAppSimpleOverlay::corner = 3;
      }
      if ((local_8 != (undefined1 *)0x0) &&
         (bVar1 = ImGui::MenuItem(in_stack_00000068,p_open,PAD._3_1_,PAD._2_1_), bVar1)) {
        *local_8 = 0;
      }
      ImGui::EndPopup();
    }
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppSimpleOverlay(bool* p_open)
{
    const float PAD = 10.0f;
    static int corner = 0;
    ImGuiIO& io = ImGui::GetIO();
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoDecoration | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoNav;
    if (corner != -1)
    {
        const ImGuiViewport* viewport = ImGui::GetMainViewport();
        ImVec2 work_pos = viewport->WorkPos; // Use work area to avoid menu-bar/task-bar, if any!
        ImVec2 work_size = viewport->WorkSize;
        ImVec2 window_pos, window_pos_pivot;
        window_pos.x = (corner & 1) ? (work_pos.x + work_size.x - PAD) : (work_pos.x + PAD);
        window_pos.y = (corner & 2) ? (work_pos.y + work_size.y - PAD) : (work_pos.y + PAD);
        window_pos_pivot.x = (corner & 1) ? 1.0f : 0.0f;
        window_pos_pivot.y = (corner & 2) ? 1.0f : 0.0f;
        ImGui::SetNextWindowPos(window_pos, ImGuiCond_Always, window_pos_pivot);
        window_flags |= ImGuiWindowFlags_NoMove;
    }
    ImGui::SetNextWindowBgAlpha(0.35f); // Transparent background
    if (ImGui::Begin("Example: Simple overlay", p_open, window_flags))
    {
        ImGui::Text("Simple overlay\n" "in the corner of the screen.\n" "(right-click to change position)");
        ImGui::Separator();
        if (ImGui::IsMousePosValid())
            ImGui::Text("Mouse Position: (%.1f,%.1f)", io.MousePos.x, io.MousePos.y);
        else
            ImGui::Text("Mouse Position: <invalid>");
        if (ImGui::BeginPopupContextWindow())
        {
            if (ImGui::MenuItem("Custom",       NULL, corner == -1)) corner = -1;
            if (ImGui::MenuItem("Top-left",     NULL, corner == 0)) corner = 0;
            if (ImGui::MenuItem("Top-right",    NULL, corner == 1)) corner = 1;
            if (ImGui::MenuItem("Bottom-left",  NULL, corner == 2)) corner = 2;
            if (ImGui::MenuItem("Bottom-right", NULL, corner == 3)) corner = 3;
            if (p_open && ImGui::MenuItem("Close")) *p_open = false;
            ImGui::EndPopup();
        }
    }
    ImGui::End();
}